

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytobin.cpp
# Opt level: O0

void __thiscall VulnerabilityToBin::ReadVulnerabilityFileNoChecks(VulnerabilityToBin *this)

{
  int iVar1;
  char *pcVar2;
  VulnerabilityToBin *this_local;
  
  ReadFirstVulnerabilityLine(this);
  (**(this->super_ValidateVulnerability)._vptr_ValidateVulnerability)();
  while (pcVar2 = fgets((this->super_ValidateVulnerability).super_Validate.line_,0x1000,_stdin),
        pcVar2 != (char *)0x0) {
    iVar1 = ValidateVulnerability::ScanLine(&this->super_ValidateVulnerability);
    if (iVar1 == 4) {
      (this->super_ValidateVulnerability).v_.vulnerability_id =
           (int)(this->super_ValidateVulnerability).initialVulID_;
      if ((((this->super_ValidateVulnerability).useIndexFile_ & 1U) != 0) &&
         ((this->super_ValidateVulnerability).v_.vulnerability_id !=
          (this->super_ValidateVulnerability).prevVulID_)) {
        (*(this->super_ValidateVulnerability)._vptr_ValidateVulnerability[1])();
        (this->super_ValidateVulnerability).prevVulID_ =
             (this->super_ValidateVulnerability).v_.vulnerability_id;
      }
      (**(this->super_ValidateVulnerability)._vptr_ValidateVulnerability)();
    }
    else {
      fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
              (ulong)(uint)(this->super_ValidateVulnerability).super_Validate.lineno_,
              &(this->super_ValidateVulnerability).super_Validate);
      Validate::PrintErrorMessage(&(this->super_ValidateVulnerability).super_Validate);
    }
  }
  if (((this->super_ValidateVulnerability).useIndexFile_ & 1U) != 0) {
    (*(this->super_ValidateVulnerability)._vptr_ValidateVulnerability[1])();
  }
  return;
}

Assistant:

void VulnerabilityToBin::ReadVulnerabilityFileNoChecks() {

  ReadFirstVulnerabilityLine();
  WriteBinVulnerabilityFile();

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      v_.vulnerability_id = int(initialVulID_);

      if (useIndexFile_) {

        if (v_.vulnerability_id != prevVulID_) {

          WriteIdxVulnerabilityFile();
	  prevVulID_ = v_.vulnerability_id;

        }

      }

      WriteBinVulnerabilityFile();
      continue;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  if (useIndexFile_) WriteIdxVulnerabilityFile();

}